

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O2

bool libwebm::CopyPrimaryChromaticity
               (PrimaryChromaticity *parser_pc,PrimaryChromaticityPtr *muxer_pc)

{
  PrimaryChromaticity *__p;
  
  __p = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
  if (__p != (PrimaryChromaticity *)0x0) {
    *__p = *parser_pc;
  }
  std::
  __uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
  ::reset((__uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
           *)muxer_pc,(pointer)__p);
  return true;
}

Assistant:

bool CopyPrimaryChromaticity(const mkvparser::PrimaryChromaticity& parser_pc,
                             PrimaryChromaticityPtr* muxer_pc) {
  muxer_pc->reset(new (std::nothrow)
                      mkvmuxer::PrimaryChromaticity(parser_pc.x, parser_pc.y));
  if (!muxer_pc)
    return false;
  return true;
}